

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Metadata * kj::anon_unknown_8::statToMetadata(Metadata *__return_storage_ptr__,stat *stats)

{
  Type type;
  uint linkCount;
  unsigned_long size;
  unsigned_long spaceUsed;
  Date lastModified;
  __syscall_slong_t extraout_RDX;
  timespec tv;
  long local_28;
  ulong local_20;
  uint64_t hash;
  uint64_t d;
  stat *stats_local;
  
  hash = stats->st_dev;
  local_20 = (hash << 0x20 | hash >> 0x20) ^ stats->st_ino;
  d = (uint64_t)stats;
  type = modeToType(stats->st_mode);
  size = implicitCast<unsigned_long,long&>((long *)(d + 0x30));
  local_28 = *(long *)(d + 0x40) << 9;
  spaceUsed = implicitCast<unsigned_long,long>(&local_28);
  tv.tv_nsec = extraout_RDX;
  tv.tv_sec = *(__time_t *)(d + 0x60);
  lastModified = toKjDate(*(anon_unknown_8 **)(d + 0x58),tv);
  linkCount = implicitCast<unsigned_int,unsigned_long&>((unsigned_long *)(d + 0x10));
  FsNode::Metadata::Metadata
            (__return_storage_ptr__,type,size,spaceUsed,lastModified,linkCount,local_20);
  return __return_storage_ptr__;
}

Assistant:

static FsNode::Metadata statToMetadata(struct stat& stats) {
  // Probably st_ino and st_dev are usually under 32 bits, so mix by rotating st_dev left 32 bits
  // and XOR.
  uint64_t d = stats.st_dev;
  uint64_t hash = ((d << 32) | (d >> 32)) ^ stats.st_ino;

  return FsNode::Metadata {
    modeToType(stats.st_mode),
    implicitCast<uint64_t>(stats.st_size),
    implicitCast<uint64_t>(stats.st_blocks * 512u),
#if __APPLE__
    toKjDate(stats.st_mtimespec),
#else
    toKjDate(stats.st_mtim),
#endif
    implicitCast<uint>(stats.st_nlink),
    hash
  };
}